

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

void repTextClose(UText *ut)

{
  Replaceable *rep;
  UText *ut_local;
  
  if ((ut->providerProperties & 0x20U) != 0) {
    if ((long *)ut->context != (long *)0x0) {
      (**(code **)(*ut->context + 8))();
    }
    ut->context = (void *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV
repTextClose(UText *ut) {
    // Most of the work of close is done by the generic UText framework close.
    // All that needs to be done here is delete the Replaceable if the UText
    //  owns it.  This occurs if the UText was created by cloning.
    if (ut->providerProperties & I32_FLAG(UTEXT_PROVIDER_OWNS_TEXT)) {
        Replaceable *rep = (Replaceable *)ut->context;
        delete rep;
        ut->context = NULL;
    }
}